

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyFindTITLE(TidyDocImpl *doc)

{
  bool bVar1;
  Node *local_18;
  Node *node;
  TidyDocImpl *doc_local;
  
  local_18 = prvTidyFindHEAD(doc);
  if (local_18 != (Node *)0x0) {
    local_18 = local_18->content;
    while( true ) {
      bVar1 = false;
      if (local_18 != (Node *)0x0) {
        bVar1 = false;
        if ((local_18 != (Node *)0x0) && (bVar1 = false, local_18->tag != (Dict *)0x0)) {
          bVar1 = local_18->tag->id == TidyTag_TITLE;
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (!bVar1) break;
      local_18 = local_18->next;
    }
  }
  return local_18;
}

Assistant:

Node *TY_(FindTITLE)(TidyDocImpl* doc)
{
    Node *node = TY_(FindHEAD)(doc);

    if (node)
        for (node = node->content;
             node && !nodeIsTITLE(node);
             node = node->next) {}

    return node;
}